

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryOutStream.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_19ea3::TestDefaultIsEmptyString::RunImpl(TestDefaultIsEmptyString *this)

{
  TestResults *pTVar1;
  bool bVar2;
  char *pcVar3;
  TestResults **ppTVar4;
  TestDetails **ppTVar5;
  TestDetails local_218 [2];
  TestDetails local_1d8;
  undefined1 local_1a8 [8];
  MemoryOutStream stream;
  TestDefaultIsEmptyString *this_local;
  
  stream._400_8_ = this;
  UnitTest::MemoryOutStream::MemoryOutStream((MemoryOutStream *)local_1a8);
  pcVar3 = UnitTest::MemoryOutStream::GetText((MemoryOutStream *)local_1a8);
  bVar2 = UnitTest::Check<bool>(pcVar3 != (char *)0x0);
  if (!bVar2) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_1d8,*ppTVar5,0xe);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_1d8,"stream.GetText() != 0");
  }
  ppTVar4 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar4;
  pcVar3 = UnitTest::MemoryOutStream::GetText((MemoryOutStream *)local_1a8);
  ppTVar5 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(local_218,*ppTVar5,0xf);
  UnitTest::CheckEqual(pTVar1,"",pcVar3,local_218);
  UnitTest::MemoryOutStream::~MemoryOutStream((MemoryOutStream *)local_1a8);
  return;
}

Assistant:

TEST(DefaultIsEmptyString)
{
    MemoryOutStream const stream;
    CHECK(stream.GetText() != 0);
    CHECK_EQUAL("", stream.GetText());
}